

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O0

Pass * wasm::createAbstractTypeRefiningPass(void)

{
  AbstractTypeRefining *this;
  
  this = (AbstractTypeRefining *)operator_new(0x108);
  memset(this,0,0x108);
  anon_unknown_22::AbstractTypeRefining::AbstractTypeRefining(this);
  return &this->super_Pass;
}

Assistant:

Pass* createAbstractTypeRefiningPass() { return new AbstractTypeRefining(); }